

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode Curl_connect(Curl_easy *data,_Bool *asyncp,_Bool *protocol_done)

{
  connectdata *local_38;
  connectdata *conn;
  _Bool *p_Stack_28;
  CURLcode result;
  _Bool *protocol_done_local;
  _Bool *asyncp_local;
  Curl_easy *data_local;
  
  *asyncp = false;
  p_Stack_28 = protocol_done;
  protocol_done_local = asyncp;
  asyncp_local = (_Bool *)data;
  Curl_free_request_state(data);
  memset(asyncp_local + 0xd0,0,0xe0);
  asyncp_local[0xd8] = true;
  asyncp_local[0xd9] = true;
  asyncp_local[0xda] = true;
  asyncp_local[0xdb] = true;
  asyncp_local[0xdc] = true;
  asyncp_local[0xdd] = true;
  asyncp_local[0xde] = true;
  asyncp_local[0xdf] = true;
  asyncp_local[0xd0] = true;
  asyncp_local[0xd1] = true;
  asyncp_local[0xd2] = true;
  asyncp_local[0xd3] = true;
  asyncp_local[0xd4] = true;
  asyncp_local[0xd5] = true;
  asyncp_local[0xd6] = true;
  asyncp_local[0xd7] = true;
  conn._4_4_ = create_conn((Curl_easy *)asyncp_local,&local_38,protocol_done_local);
  if (conn._4_4_ == CURLE_OK) {
    if ((local_38->easyq).size < 2) {
      if ((*protocol_done_local & 1U) == 0) {
        conn._4_4_ = Curl_setup_conn((Curl_easy *)asyncp_local,p_Stack_28);
      }
    }
    else {
      *p_Stack_28 = true;
    }
  }
  if (conn._4_4_ == CURLE_NO_CONNECTION_AVAILABLE) {
    data_local._4_4_ = conn._4_4_;
  }
  else {
    if ((conn._4_4_ != CURLE_OK) && (local_38 != (connectdata *)0x0)) {
      Curl_detach_connection((Curl_easy *)asyncp_local);
      Curl_conncache_remove_conn((Curl_easy *)asyncp_local,local_38,true);
      Curl_disconnect((Curl_easy *)asyncp_local,local_38,true);
    }
    data_local._4_4_ = conn._4_4_;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_connect(struct Curl_easy *data,
                      bool *asyncp,
                      bool *protocol_done)
{
  CURLcode result;
  struct connectdata *conn;

  *asyncp = FALSE; /* assume synchronous resolves by default */

  /* init the single-transfer specific data */
  Curl_free_request_state(data);
  memset(&data->req, 0, sizeof(struct SingleRequest));
  data->req.size = data->req.maxdownload = -1;

  /* call the stuff that needs to be called */
  result = create_conn(data, &conn, asyncp);

  if(!result) {
    if(CONN_INUSE(conn) > 1)
      /* multiplexed */
      *protocol_done = TRUE;
    else if(!*asyncp) {
      /* DNS resolution is done: that's either because this is a reused
         connection, in which case DNS was unnecessary, or because DNS
         really did finish already (synch resolver/fast async resolve) */
      result = Curl_setup_conn(data, protocol_done);
    }
  }

  if(result == CURLE_NO_CONNECTION_AVAILABLE) {
    return result;
  }
  else if(result && conn) {
    /* We're not allowed to return failure with memory left allocated in the
       connectdata struct, free those here */
    Curl_detach_connection(data);
    Curl_conncache_remove_conn(data, conn, TRUE);
    Curl_disconnect(data, conn, TRUE);
  }

  return result;
}